

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void keymap_browse_hook(wchar_t oid,void *db,region *loc)

{
  char tmp [1024];
  
  event_signal(EVENT_MESSAGE_FLUSH);
  clear_from(L'\r');
  prt("Current action (if any) shown below:",L'\r',L'\0');
  keypress_to_text(tmp,0x400,keymap_buffer,false);
  prt(tmp,L'\x0e',L'\0');
  return;
}

Assistant:

static void keymap_browse_hook(int oid, void *db, const region *loc)
{
	char tmp[1024];

	event_signal(EVENT_MESSAGE_FLUSH);

	clear_from(13);

	/* Show current action */
	prt("Current action (if any) shown below:", 13, 0);
	keypress_to_text(tmp, sizeof(tmp), keymap_buffer, false);
	prt(tmp, 14, 0);
}